

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

char * detect_proxy(connectdata *conn)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  char *no_proxy;
  char *pcVar4;
  char *pcVar5;
  char proxy_env [128];
  char local_98 [128];
  
  pcVar5 = local_98;
  no_proxy = curl_getenv("no_proxy");
  if (no_proxy == (char *)0x0) {
    no_proxy = curl_getenv("NO_PROXY");
  }
  _Var2 = check_noproxy((conn->host).name,no_proxy);
  if (_Var2) {
    pcVar5 = (char *)0x0;
    goto LAB_00560e5b;
  }
  pcVar4 = conn->handler->scheme;
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    iVar3 = tolower((int)cVar1);
    *pcVar5 = (char)iVar3;
    pcVar5 = (char *)((long)pcVar5 + 1);
    cVar1 = *pcVar4;
  }
  *(undefined4 *)((long)pcVar5 + 3) = 0x79786f;
  *(undefined4 *)pcVar5 = 0x6f72705f;
  pcVar5 = curl_getenv(local_98);
  if (pcVar5 == (char *)0x0) {
    iVar3 = Curl_raw_equal("http_proxy",local_98);
    if (iVar3 == 0) {
      Curl_strntoupper(local_98,local_98,0x80);
      pcVar5 = curl_getenv(local_98);
      if (pcVar5 != (char *)0x0) goto LAB_00560e1b;
    }
  }
  else {
LAB_00560e1b:
    if (*pcVar5 != '\0') goto LAB_00560e5b;
  }
  pcVar5 = curl_getenv("all_proxy");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = curl_getenv("ALL_PROXY");
  }
LAB_00560e5b:
  if (no_proxy != (char *)0x0) {
    (*Curl_cfree)(no_proxy);
  }
  return pcVar5;
}

Assistant:

static char *detect_proxy(struct connectdata *conn)
{
  char *proxy = NULL;

#ifndef CURL_DISABLE_HTTP
  /* If proxy was not specified, we check for default proxy environment
   * variables, to enable i.e Lynx compliance:
   *
   * http_proxy=http://some.server.dom:port/
   * https_proxy=http://some.server.dom:port/
   * ftp_proxy=http://some.server.dom:port/
   * no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   * all_proxy=http://some.server.dom:port/
   *   (seems to exist for the CERN www lib. Probably
   *   the first to check for.)
   *
   * For compatibility, the all-uppercase versions of these variables are
   * checked if the lowercase versions don't exist.
   */
  char *no_proxy=NULL;
  char proxy_env[128];

  no_proxy=curl_getenv("no_proxy");
  if(!no_proxy)
    no_proxy=curl_getenv("NO_PROXY");

  if(!check_noproxy(conn->host.name, no_proxy)) {
    /* It was not listed as without proxy */
    const char *protop = conn->handler->scheme;
    char *envp = proxy_env;
    char *prox;

    /* Now, build <protocol>_proxy and check for such a one to use */
    while(*protop)
      *envp++ = (char)tolower((int)*protop++);

    /* append _proxy */
    strcpy(envp, "_proxy");

    /* read the protocol proxy: */
    prox=curl_getenv(proxy_env);

    /*
     * We don't try the uppercase version of HTTP_PROXY because of
     * security reasons:
     *
     * When curl is used in a webserver application
     * environment (cgi or php), this environment variable can
     * be controlled by the web server user by setting the
     * http header 'Proxy:' to some value.
     *
     * This can cause 'internal' http/ftp requests to be
     * arbitrarily redirected by any external attacker.
     */
    if(!prox && !Curl_raw_equal("http_proxy", proxy_env)) {
      /* There was no lowercase variable, try the uppercase version: */
      Curl_strntoupper(proxy_env, proxy_env, sizeof(proxy_env));
      prox=curl_getenv(proxy_env);
    }

    if(prox && *prox) { /* don't count "" strings */
      proxy = prox; /* use this */
    }
    else {
      proxy = curl_getenv("all_proxy"); /* default proxy to use */
      if(!proxy)
        proxy=curl_getenv("ALL_PROXY");
    }
  } /* if(!check_noproxy(conn->host.name, no_proxy)) - it wasn't specified
       non-proxy */
  if(no_proxy)
    free(no_proxy);

#else /* !CURL_DISABLE_HTTP */

  (void)conn;
#endif /* CURL_DISABLE_HTTP */

  return proxy;
}